

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

void __thiscall PruneReplayer::access_descriptor_set(PruneReplayer *this,Hash hash)

{
  mapped_type pVVar1;
  VkDescriptorSetLayoutBinding *pVVar2;
  size_type sVar3;
  mapped_type *ppVVar4;
  uint local_44;
  uint32_t i;
  VkDescriptorSetLayoutBinding *bind;
  uint32_t binding;
  VkDescriptorSetLayoutCreateInfo *create_info;
  Hash local_18;
  Hash hash_local;
  PruneReplayer *this_local;
  
  if ((hash != 0) &&
     (local_18 = hash, hash_local = (Hash)this,
     sVar3 = std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::count(&this->accessed_descriptor_sets,&local_18), sVar3 == 0)) {
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert(&this->accessed_descriptor_sets,&local_18);
    ppVVar4 = std::
              unordered_map<unsigned_long,_const_VkDescriptorSetLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkDescriptorSetLayoutCreateInfo_*>_>_>
              ::operator[](&this->descriptor_sets,&local_18);
    pVVar1 = *ppVVar4;
    if (pVVar1 != (mapped_type)0x0) {
      for (bind._4_4_ = 0; bind._4_4_ < pVVar1->bindingCount; bind._4_4_ = bind._4_4_ + 1) {
        pVVar2 = pVVar1->pBindings;
        if ((pVVar2[bind._4_4_].pImmutableSamplers != (VkSampler *)0x0) &&
           (pVVar2[bind._4_4_].descriptorCount != 0)) {
          for (local_44 = 0; local_44 < pVVar2[bind._4_4_].descriptorCount; local_44 = local_44 + 1)
          {
            if (pVVar2[bind._4_4_].pImmutableSamplers[local_44] != (VkSampler)0x0) {
              access_sampler(this,(Hash)pVVar2[bind._4_4_].pImmutableSamplers[local_44]);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void access_descriptor_set(Hash hash)
	{
		if (!hash)
			return;
		if (accessed_descriptor_sets.count(hash))
			return;
		accessed_descriptor_sets.insert(hash);

		auto *create_info = descriptor_sets[hash];
		if (!create_info)
			return;

		for (uint32_t binding = 0; binding < create_info->bindingCount; binding++)
		{
			auto &bind = create_info->pBindings[binding];
			if (bind.pImmutableSamplers && bind.descriptorCount != 0)
			{
				for (uint32_t i = 0; i < bind.descriptorCount; i++)
					if (bind.pImmutableSamplers[i] != VK_NULL_HANDLE)
						access_sampler((Hash)bind.pImmutableSamplers[i]);
			}
		}
	}